

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev-primality-test.cpp
# Opt level: O0

polynomial * __thiscall polynomial::operator*(polynomial *this,polynomial *other)

{
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  long in_RDX;
  uint64_t *in_RSI;
  polynomial *in_RDI;
  int j;
  int i;
  uint64_t r;
  polynomial *ret;
  polynomial *n;
  polynomial *in_stack_ffffffffffffffc0;
  int local_2c;
  int local_28;
  
  n = in_RDI;
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 1));
  polynomial(in_stack_ffffffffffffffc0,(uint64_t)in_RSI,(uint64_t)n);
  for (local_28 = 0; (ulong)(long)local_28 < sVar1; local_28 = local_28 + 1) {
    for (local_2c = 0; (ulong)(long)local_2c < sVar1; local_2c = local_2c + 1) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&n->p,(ulong)(long)(local_28 + local_2c) % sVar1);
      uVar5 = *pvVar2;
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 1),
                          (long)local_28);
      uVar4 = *pvVar2;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDX + 8),
                          (long)local_2c);
      uVar4 = gaIMulMod(uVar4,*pvVar3,*in_RSI);
      uVar5 = gaIAddMod(uVar5,uVar4,*in_RSI);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&n->p,(ulong)(long)(local_28 + local_2c) % sVar1);
      *pvVar2 = uVar5;
    }
  }
  return in_RDI;
}

Assistant:

polynomial operator* (const polynomial& other) {
        uint64_t r = this->p.size();
        polynomial ret(r, n);
        for (int i = 0; i < r; i++) {
            for (int j = 0; j < r; j++) {
                 ret.p[(i+j) % r] = gaIAddMod(ret.p[(i+j) % r], gaIMulMod(this->p[i], other.p[j], this->n), this->n);
            }
        }
        return ret;
    }